

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

uint32_t do_helper_clc(CPUS390XState_conflict *env,uint32_t l,uint64_t s1,uint64_t s2,uintptr_t ra)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = 0;
  uVar5 = 0;
  do {
    if (l < uVar5) {
      return uVar4;
    }
    uVar1 = cpu_ldub_data_ra_s390x(env,uVar5 + s1,ra);
    uVar2 = cpu_ldub_data_ra_s390x(env,uVar5 + s2,ra);
    uVar6 = uVar1 & 0xff;
    uVar3 = uVar2 & 0xff;
    uVar5 = uVar5 + 1;
    if (uVar6 >= uVar3 && uVar6 != uVar3) {
      uVar4 = 2;
    }
    if (uVar6 < uVar3) {
      uVar4 = 1;
    }
  } while (uVar6 == uVar3);
  return uVar4;
}

Assistant:

static uint32_t do_helper_clc(CPUS390XState *env, uint32_t l, uint64_t s1,
                              uint64_t s2, uintptr_t ra)
{
    uint32_t i;
    uint32_t cc = 0;

    HELPER_LOG("%s l %d s1 %" PRIx64 " s2 %" PRIx64 "\n",
               __func__, l, s1, s2);

    for (i = 0; i <= l; i++) {
        uint8_t x = cpu_ldub_data_ra(env, s1 + i, ra);
        uint8_t y = cpu_ldub_data_ra(env, s2 + i, ra);
        HELPER_LOG("%02x (%c)/%02x (%c) ", x, x, y, y);
        if (x < y) {
            cc = 1;
            break;
        } else if (x > y) {
            cc = 2;
            break;
        }
    }

    HELPER_LOG("\n");
    return cc;
}